

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void upb_test::CheckFile(FileDefPtr file,google_protobuf_FileDescriptorProto *proto)

{
  EqualsUpbProtoMatcherP2<google_protobuf_FileDescriptorProto_*,_const_upb_MessageDef_*(*)(upb_DefPool_*)>
  matcher;
  bool bVar1;
  upb_FileDef *f;
  upb_Arena *a;
  google_protobuf_FileDescriptorProto *gmock_p0;
  char *message;
  _Head_base<0UL,_google_protobuf_FileDescriptorProto_*,_false> in_stack_ffffffffffffff48;
  AssertHelper local_80;
  Message local_78;
  upb_test local_70 [8];
  _Tuple_impl<1UL,_const_upb_MessageDef_*(*)(upb_DefPool_*)> _Stack_68;
  char local_60 [16];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  google_protobuf_FileDescriptorProto *proto2;
  Arena arena;
  google_protobuf_FileDescriptorProto *proto_local;
  FileDefPtr file_local;
  
  arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = (upb_Arena *)proto;
  proto_local = (google_protobuf_FileDescriptorProto *)file.ptr_;
  upb::Arena::Arena((Arena *)&proto2);
  f = upb::FileDefPtr::ptr((FileDefPtr *)&proto_local);
  a = upb::Arena::ptr((Arena *)&proto2);
  gmock_p0 = upb_FileDef_ToProto(f,a);
  EqualsUpbProto<google_protobuf_FileDescriptorProto*,upb_MessageDef_const*(*)(upb_DefPool*)>
            (local_70,gmock_p0,google_protobuf_FileDescriptorProto_getmsgdef);
  matcher.
  super_MatcherBaseImpl<upb_test::EqualsUpbProtoMatcherP2<google_protobuf_FileDescriptorProto_*,_const_upb_MessageDef_*(*)(upb_DefPool_*)>_>
  .params_.
  super__Tuple_impl<0UL,_google_protobuf_FileDescriptorProto_*,_const_upb_MessageDef_*(*)(upb_DefPool_*)>
  .super__Head_base<0UL,_google_protobuf_FileDescriptorProto_*,_false>._M_head_impl =
       in_stack_ffffffffffffff48._M_head_impl;
  matcher.
  super_MatcherBaseImpl<upb_test::EqualsUpbProtoMatcherP2<google_protobuf_FileDescriptorProto_*,_const_upb_MessageDef_*(*)(upb_DefPool_*)>_>
  .params_.
  super__Tuple_impl<0UL,_google_protobuf_FileDescriptorProto_*,_const_upb_MessageDef_*(*)(upb_DefPool_*)>
  .super__Tuple_impl<1UL,_const_upb_MessageDef_*(*)(upb_DefPool_*)>.
  super__Head_base<1UL,_const_upb_MessageDef_*(*)(upb_DefPool_*),_false>._M_head_impl =
       _Stack_68.super__Head_base<1UL,_const_upb_MessageDef_*(*)(upb_DefPool_*),_false>._M_head_impl
  ;
  testing::internal::
  MakePredicateFormatterFromMatcher<upb_test::EqualsUpbProtoMatcherP2<google_protobuf_FileDescriptorProto*,upb_MessageDef_const*(*)(upb_DefPool*)>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<upb_test::EqualsUpbProtoMatcherP2<google_protobuf_FileDescriptorProto*,upb_MessageDef_const*(*)(upb_DefPool*)>>
  ::operator()(local_50,local_60,(google_protobuf_FileDescriptorProto **)0x80cd4d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/util/def_to_proto_test.cc"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  upb::Arena::~Arena((Arena *)&proto2);
  return;
}

Assistant:

void CheckFile(const upb::FileDefPtr file,
               const google_protobuf_FileDescriptorProto* proto) {
  upb::Arena arena;
  google_protobuf_FileDescriptorProto* proto2 =
      upb_FileDef_ToProto(file.ptr(), arena.ptr());
  ASSERT_THAT(
      proto,
      EqualsUpbProto(proto2, google_protobuf_FileDescriptorProto_getmsgdef));
}